

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

int32_t __thiscall Bitmap::getPixelIndex(Bitmap *this,int32_t x,int32_t y)

{
  uint uVar1;
  int32_t iVar2;
  
  uVar1 = this->width;
  if (this->orientation == Horizontally) {
    iVar2 = -1;
    if ((uint)y < this->height && (uint)x < uVar1) {
      return uVar1 * y + x;
    }
  }
  else {
    iVar2 = -1;
    if ((uint)x < this->height && (uint)y < uVar1) {
      iVar2 = x * uVar1 + ~y + uVar1;
    }
  }
  return iVar2;
}

Assistant:

int32_t Bitmap::getPixelIndex(const int32_t x, const int32_t y)
{
   if (orientation == Orientation::Horizontally)
   {
      //check for label under- and overflow
      if ((uint32_t)x >= this->width) return -1;
      if ((uint32_t)y >= this->height) return -1;
      //otherwise
      return (y * this->width) + x;
   }
   else //Vertically
   {
      //check for label under- and overflow
      if ((uint32_t)y >= this->width) return -1;
      if ((uint32_t)x >= this->height) return -1;
      //otherwise
      return ((this->width - 1) - y) + (x * this->width);
   }
}